

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite_transaction.cpp
# Opt level: O0

void __thiscall
cpp_db::sqlite_transaction::sqlite_transaction
          (sqlite_transaction *this,shared_connection_ptr *conn_in)

{
  bool bVar1;
  db_exception *this_00;
  allocator<char> local_39;
  string local_38;
  shared_ptr<cpp_db::connection_interface> *local_18;
  shared_connection_ptr *conn_in_local;
  sqlite_transaction *this_local;
  
  local_18 = conn_in;
  conn_in_local = (shared_connection_ptr *)this;
  transaction_interface::transaction_interface(&this->super_transaction_interface);
  (this->super_transaction_interface)._vptr_transaction_interface =
       (_func_int **)&PTR__sqlite_transaction_00253998;
  std::weak_ptr<cpp_db::connection_interface>::weak_ptr<cpp_db::connection_interface,void>
            (&this->conn,local_18);
  this->open_count = 0;
  bVar1 = std::__weak_ptr<cpp_db::connection_interface,_(__gnu_cxx::_Lock_policy)2>::expired
                    (&(this->conn).
                      super___weak_ptr<cpp_db::connection_interface,_(__gnu_cxx::_Lock_policy)2>);
  if (!bVar1) {
    return;
  }
  this_00 = (db_exception *)__cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"No database connection!",&local_39);
  db_exception::db_exception(this_00,&local_38);
  __cxa_throw(this_00,&db_exception::typeinfo,db_exception::~db_exception);
}

Assistant:

sqlite_transaction::sqlite_transaction(const shared_connection_ptr &conn_in)
	: conn(conn_in)
    , open_count(0)
{
	if (conn.expired())
        throw db_exception("No database connection!");
}